

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::RecordIntConstant(FunctionBody *this,RegSlot location,uint val)

{
  bool bVar1;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  undefined8 local_68;
  Var intConst;
  ScriptContext *scriptContext;
  uint val_local;
  RegSlot location_local;
  FunctionBody *this_local;
  undefined8 local_28;
  undefined8 local_10;
  
  this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar1 = ScriptConfiguration::Force32BitByteCode(this_01);
  if (bVar1) {
    if (((int)val < 0x40000000) && (-0x40000000 < (int)val)) {
      local_28 = TaggedInt::ToVarUnchecked(val);
    }
    else {
      local_28 = JavascriptNumber::NewInlined((double)(int)val,this_00);
    }
    local_68 = local_28;
  }
  else {
    bVar1 = TaggedInt::IsOverflow(val);
    if (bVar1) {
      local_10 = JavascriptNumber::NewInlined((double)(int)val,this_00);
    }
    else {
      local_10 = TaggedInt::ToVarUnchecked(val);
    }
    local_68 = local_10;
  }
  RecordConstant(this,location,local_68);
  return;
}

Assistant:

void FunctionBody::RecordIntConstant(RegSlot location, unsigned int val)
    {
        ScriptContext *scriptContext = this->GetScriptContext();
#ifdef ENABLE_TEST_HOOKS
        Var intConst = scriptContext->GetConfig()->Force32BitByteCode() ?
            JavascriptNumber::ToVarFor32BitBytecode((int32)val, scriptContext) :
            JavascriptNumber::ToVar((int32)val, scriptContext);
#else
        Var intConst = JavascriptNumber::ToVar((int32)val, scriptContext);
#endif
        this->RecordConstant(location, intConst);
    }